

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O2

void embree::sse2::OrientedDiscMiIntersectorK<4,_4,_true>::intersect
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *Disc)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float fVar6;
  undefined4 uVar7;
  Scene *pSVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  float fVar18;
  float fVar19;
  int iVar20;
  undefined4 uVar21;
  ulong uVar22;
  RTCFilterFunctionN p_Var23;
  RTCRayN *pRVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  undefined1 auVar67 [16];
  float fVar68;
  float fVar70;
  float fVar71;
  undefined1 auVar69 [16];
  float fVar72;
  vbool<4> valid;
  undefined1 local_1c8 [16];
  RayQueryContext *local_1b8;
  float fStack_1b0;
  float fStack_1ac;
  RTCFilterFunctionNArguments args;
  undefined1 local_168 [16];
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined1 local_138 [16];
  float local_128 [4];
  float local_118 [4];
  undefined8 local_108 [2];
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined8 local_e8;
  float fStack_e0;
  float fStack_dc;
  float local_d8 [2];
  uint uStack_d0;
  uint uStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [16];
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  pSVar8 = context->scene;
  uStack_d0 = Disc->sharedGeomID;
  uVar22 = (ulong)(Disc->primIDs).field_0.i[0];
  pGVar9 = (pSVar8->geometries).items[uStack_d0].ptr;
  lVar25 = *(long *)&pGVar9->field_0x58;
  _Var10 = pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar1 = (float *)(lVar25 + _Var10 * uVar22);
  fVar61 = *pfVar1;
  fVar56 = pfVar1[2];
  uVar26 = (ulong)(Disc->primIDs).field_0.i[1];
  pfVar2 = (float *)(lVar25 + _Var10 * uVar26);
  fVar63 = *pfVar2;
  fVar57 = pfVar2[2];
  fStack_f0 = pfVar2[3];
  uVar27 = (ulong)(Disc->primIDs).field_0.i[2];
  pfVar3 = (float *)(lVar25 + _Var10 * uVar27);
  uVar28 = (ulong)(Disc->primIDs).field_0.i[3];
  pfVar4 = (float *)(lVar25 + _Var10 * uVar28);
  fStack_ec = pfVar4[3];
  local_1b8 = (RayQueryContext *)CONCAT44(fVar63,fVar61);
  lVar25 = *(long *)&pGVar9[1].time_range.upper;
  p_Var23 = pGVar9[1].intersectionFilterN;
  pfVar5 = (float *)(lVar25 + uVar22 * (long)p_Var23);
  local_128[0] = *pfVar5;
  local_118[0] = pfVar5[1];
  fVar18 = pfVar5[2];
  pfVar5 = (float *)(lVar25 + uVar26 * (long)p_Var23);
  local_128[1] = *pfVar5;
  local_118[1] = pfVar5[1];
  fVar19 = pfVar5[2];
  pfVar5 = (float *)(lVar25 + uVar27 * (long)p_Var23);
  local_128[2] = *pfVar5;
  local_118[2] = pfVar5[1];
  local_f8 = pfVar5[2];
  pfVar5 = (float *)(lVar25 + (long)p_Var23 * uVar28);
  local_128[3] = *pfVar5;
  local_118[3] = pfVar5[1];
  fStack_f4 = pfVar5[2];
  uStack_cc = uStack_d0;
  fVar55 = *(float *)(ray + k * 4 + 0x10);
  fVar59 = *(float *)(ray + k * 4 + 0x20);
  fVar52 = *(float *)(ray + k * 4 + 0x40);
  fVar58 = *(float *)(ray + k * 4 + 0x50);
  fVar6 = *(float *)(ray + k * 4 + 0x60);
  fVar60 = local_128[0] * fVar52 + local_118[0] * fVar58 + fVar18 * fVar6;
  fVar62 = local_128[1] * fVar52 + local_118[1] * fVar58 + fVar19 * fVar6;
  fVar64 = local_128[2] * fVar52 + local_118[2] * fVar58 + local_f8 * fVar6;
  fVar66 = local_128[3] * fVar52 + local_118[3] * fVar58 + fStack_f4 * fVar6;
  uVar29 = -(uint)(fVar60 != 0.0);
  uVar30 = -(uint)(fVar62 != 0.0);
  uVar31 = -(uint)(fVar64 != 0.0);
  uVar32 = -(uint)(fVar66 != 0.0);
  auVar67._0_8_ = CONCAT44(~uVar30,~uVar29) & 0x3f8000003f800000;
  auVar67._8_4_ = ~uVar31 & 0x3f800000;
  auVar67._12_4_ = ~uVar32 & 0x3f800000;
  auVar46._4_4_ = (uint)fVar62 & uVar30;
  auVar46._0_4_ = (uint)fVar60 & uVar29;
  auVar46._8_4_ = (uint)fVar64 & uVar31;
  auVar46._12_4_ = (uint)fVar66 & uVar32;
  local_e8 = CONCAT44(fVar57,fVar56);
  local_d8[0] = pfVar3[2];
  local_d8[1] = pfVar4[2];
  fVar53 = *(float *)(ray + k * 4);
  auVar69._0_4_ =
       (fVar61 - fVar53) * local_128[0] +
       (pfVar1[1] - fVar55) * local_118[0] + (fVar56 - fVar59) * fVar18;
  auVar69._4_4_ =
       (fVar63 - fVar53) * local_128[1] +
       (pfVar2[1] - fVar55) * local_118[1] + (fVar57 - fVar59) * fVar19;
  auVar69._8_4_ =
       (*pfVar3 - fVar53) * local_128[2] +
       (pfVar3[1] - fVar55) * local_118[2] + (pfVar3[2] - fVar59) * local_f8;
  auVar69._12_4_ =
       (*pfVar4 - fVar53) * local_128[3] +
       (pfVar4[1] - fVar55) * local_118[3] + (pfVar4[2] - fVar59) * fStack_f4;
  local_138 = divps(auVar69,auVar67 | auVar46);
  fVar54 = *(float *)(ray + k * 4 + 0x80);
  local_168 = ZEXT416((uint)fVar54);
  fVar68 = local_138._0_4_;
  fVar70 = local_138._4_4_;
  fVar71 = local_138._8_4_;
  fVar72 = local_138._12_4_;
  fVar65 = *(float *)(ray + k * 4 + 0x30);
  uVar29 = (uint)Disc->numPrimitives;
  bVar16 = (uVar29 != 0 && fVar60 != 0.0) && (fVar65 <= fVar68 && fVar68 <= fVar54);
  auVar50._0_4_ = -(uint)bVar16;
  bVar17 = (1 < uVar29 && fVar62 != 0.0) && (fVar65 <= fVar70 && fVar70 <= fVar54);
  auVar50._4_4_ = -(uint)bVar17;
  bVar15 = (2 < uVar29 && fVar64 != 0.0) && (fVar71 <= fVar54 && fVar65 <= fVar71);
  auVar50._8_4_ = -(uint)bVar15;
  bVar14 = (3 < uVar29 && fVar66 != 0.0) && (fVar72 <= fVar54 && fVar65 <= fVar72);
  auVar50._12_4_ = -(uint)bVar14;
  iVar20 = movmskps(uVar29,auVar50);
  if (iVar20 != 0) {
    fVar61 = (fVar53 + fVar52 * fVar68) - fVar61;
    fVar63 = (fVar53 + fVar52 * fVar70) - fVar63;
    fVar65 = (fVar53 + fVar52 * fVar71) - fStack_1b0;
    fVar60 = (fVar53 + fVar52 * fVar72) - fStack_1ac;
    fVar52 = (fVar55 + fVar58 * fVar68) - pfVar1[1];
    fVar53 = (fVar55 + fVar58 * fVar70) - pfVar2[1];
    fVar54 = (fVar55 + fVar58 * fVar71) - pfVar3[1];
    fVar55 = (fVar55 + fVar58 * fVar72) - pfVar4[1];
    fVar56 = (fVar59 + fVar6 * fVar68) - fVar56;
    fVar57 = (fVar59 + fVar6 * fVar70) - fVar57;
    fVar58 = (fVar59 + fVar6 * fVar71) - fStack_e0;
    fVar59 = (fVar59 + fVar6 * fVar72) - fStack_dc;
    bVar16 = fVar61 * fVar61 + fVar52 * fVar52 + fVar56 * fVar56 < pfVar1[3] * pfVar1[3] && bVar16;
    valid.field_0.i[0] = -(uint)bVar16;
    bVar17 = fVar63 * fVar63 + fVar53 * fVar53 + fVar57 * fVar57 < fStack_f0 * fStack_f0 && bVar17;
    valid.field_0.i[1] = -(uint)bVar17;
    bVar15 = fVar65 * fVar65 + fVar54 * fVar54 + fVar58 * fVar58 < pfVar3[3] * pfVar3[3] && bVar15;
    valid.field_0.i[2] = -(uint)bVar15;
    bVar14 = fVar60 * fVar60 + fVar55 * fVar55 + fVar59 * fVar59 < fStack_ec * fStack_ec && bVar14;
    valid.field_0.i[3] = -(uint)bVar14;
    auVar12._4_4_ = valid.field_0.i[1];
    auVar12._0_4_ = valid.field_0.i[0];
    auVar12._8_4_ = valid.field_0.i[2];
    auVar12._12_4_ = valid.field_0.i[3];
    iVar20 = movmskps(iVar20,auVar12);
    if (iVar20 != 0) {
      local_148 = 0;
      uStack_140 = 0;
      local_158 = 0;
      uStack_150 = 0;
      local_108[0] = CONCAT44(fVar19,fVar18);
      auVar33._0_4_ = (uint)fVar68 & valid.field_0.i[0];
      auVar33._4_4_ = (uint)fVar70 & valid.field_0.i[1];
      auVar33._8_4_ = (uint)fVar71 & valid.field_0.i[2];
      auVar33._12_4_ = (uint)fVar72 & valid.field_0.i[3];
      auVar38._0_8_ = CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
      auVar38._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
      auVar38._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
      auVar38 = auVar38 | auVar33;
      auVar45._4_4_ = auVar38._0_4_;
      auVar45._0_4_ = auVar38._4_4_;
      auVar45._8_4_ = auVar38._12_4_;
      auVar45._12_4_ = auVar38._8_4_;
      auVar46 = minps(auVar45,auVar38);
      auVar34._0_8_ = auVar46._8_8_;
      auVar34._8_4_ = auVar46._0_4_;
      auVar34._12_4_ = auVar46._4_4_;
      auVar46 = minps(auVar34,auVar46);
      auVar35._0_4_ = -(uint)(auVar46._0_4_ == auVar38._0_4_ && bVar16);
      auVar35._4_4_ = -(uint)(auVar46._4_4_ == auVar38._4_4_ && bVar17);
      auVar35._8_4_ = -(uint)(auVar46._8_4_ == auVar38._8_4_ && bVar15);
      auVar35._12_4_ = -(uint)(auVar46._12_4_ == auVar38._12_4_ && bVar14);
      iVar20 = movmskps(iVar20,auVar35);
      uVar29 = valid.field_0.i[0];
      uVar30 = valid.field_0.i[1];
      uVar31 = valid.field_0.i[2];
      uVar32 = valid.field_0.i[3];
      if (iVar20 != 0) {
        uVar29 = auVar35._0_4_;
        uVar30 = auVar35._4_4_;
        uVar31 = auVar35._8_4_;
        uVar32 = auVar35._12_4_;
      }
      auVar13._4_4_ = uVar30;
      auVar13._0_4_ = uVar29;
      auVar13._8_4_ = uVar31;
      auVar13._12_4_ = uVar32;
      uVar29 = movmskps(iVar20,auVar13);
      lVar25 = 0;
      if (uVar29 != 0) {
        for (; (uVar29 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
        }
      }
      do {
        args.hit = (RTCHitN *)&local_c8;
        args.valid = (int *)local_1c8;
        local_68 = local_d8[lVar25];
        uVar22 = (ulong)(uint)local_68;
        pGVar9 = (pSVar8->geometries).items[uVar22].ptr;
        if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          *(undefined4 *)(local_1c8 + lVar25 * 4 + -0x10) = 0;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            uVar21 = *(undefined4 *)((long)&local_158 + lVar25 * 4);
            uVar7 = *(undefined4 *)((long)&local_148 + lVar25 * 4);
            *(float *)(ray + k * 4 + 0x80) = local_128[lVar25 + -4];
            *(float *)(ray + k * 4 + 0xc0) = local_128[lVar25];
            *(float *)(ray + k * 4 + 0xd0) = local_118[lVar25];
            *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)local_108 + lVar25 * 4);
            *(undefined4 *)(ray + k * 4 + 0xf0) = uVar21;
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar7;
            *(uint *)(ray + k * 4 + 0x110) = (Disc->primIDs).field_0.i[lVar25];
            *(float *)(ray + k * 4 + 0x120) = local_68;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            return;
          }
          local_98 = *(undefined4 *)((long)&local_158 + lVar25 * 4);
          local_88 = *(undefined4 *)((long)&local_148 + lVar25 * 4);
          local_c8 = local_128[lVar25];
          local_b8 = local_118[lVar25];
          local_78 = (Disc->primIDs).field_0.i[lVar25];
          uVar21 = *(undefined4 *)((long)local_108 + lVar25 * 4);
          local_a8._4_4_ = uVar21;
          local_a8._0_4_ = uVar21;
          local_a8._8_4_ = uVar21;
          local_a8._12_4_ = uVar21;
          fStack_c4 = local_c8;
          fStack_c0 = local_c8;
          fStack_bc = local_c8;
          fStack_b4 = local_b8;
          fStack_b0 = local_b8;
          fStack_ac = local_b8;
          uStack_94 = local_98;
          uStack_90 = local_98;
          uStack_8c = local_98;
          uStack_84 = local_88;
          uStack_80 = local_88;
          uStack_7c = local_88;
          uStack_74 = local_78;
          uStack_70 = local_78;
          uStack_6c = local_78;
          fStack_64 = local_68;
          fStack_60 = local_68;
          fStack_5c = local_68;
          local_58 = context->user->instID[0];
          uStack_54 = local_58;
          uStack_50 = local_58;
          uStack_4c = local_58;
          local_48 = context->user->instPrimID[0];
          uStack_44 = local_48;
          uStack_40 = local_48;
          uStack_3c = local_48;
          *(float *)(ray + k * 4 + 0x80) = local_128[lVar25 + -4];
          local_1c8 = *(undefined1 (*) [16])
                       (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
          args.geometryUserPtr = pGVar9->userPtr;
          args.context = context->user;
          args.N = 4;
          p_Var23 = pGVar9->intersectionFilterN;
          args.ray = (RTCRayN *)ray;
          if (p_Var23 != (RTCFilterFunctionN)0x0) {
            local_1b8 = context;
            p_Var23 = (RTCFilterFunctionN)(*p_Var23)(&args);
            context = local_1b8;
          }
          auVar39._0_4_ = -(uint)(local_1c8._0_4_ == 0);
          auVar39._4_4_ = -(uint)(local_1c8._4_4_ == 0);
          auVar39._8_4_ = -(uint)(local_1c8._8_4_ == 0);
          auVar39._12_4_ = -(uint)(local_1c8._12_4_ == 0);
          uVar29 = movmskps((int)p_Var23,auVar39);
          pRVar24 = (RTCRayN *)(ulong)(uVar29 ^ 0xf);
          if ((uVar29 ^ 0xf) == 0) {
            auVar11._8_4_ = 0xffffffff;
            auVar11._0_8_ = 0xffffffffffffffff;
            auVar11._12_4_ = 0xffffffff;
            auVar40 = auVar39 ^ auVar11;
          }
          else {
            p_Var23 = context->args->filter;
            if ((p_Var23 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
              p_Var23 = (RTCFilterFunctionN)(*p_Var23)(&args);
            }
            auVar36._0_4_ = -(uint)(local_1c8._0_4_ == 0);
            auVar36._4_4_ = -(uint)(local_1c8._4_4_ == 0);
            auVar36._8_4_ = -(uint)(local_1c8._8_4_ == 0);
            auVar36._12_4_ = -(uint)(local_1c8._12_4_ == 0);
            auVar40._8_4_ = 0xffffffff;
            auVar40._0_8_ = 0xffffffffffffffff;
            auVar40._12_4_ = 0xffffffff;
            auVar40 = auVar36 ^ auVar40;
            uVar29 = movmskps((int)p_Var23,auVar36);
            pRVar24 = (RTCRayN *)(ulong)(uVar29 ^ 0xf);
            if ((uVar29 ^ 0xf) != 0) {
              auVar47._0_4_ = *(uint *)(args.ray + 0xc0) & auVar36._0_4_;
              auVar47._4_4_ = *(uint *)(args.ray + 0xc4) & auVar36._4_4_;
              auVar47._8_4_ = *(uint *)(args.ray + 200) & auVar36._8_4_;
              auVar47._12_4_ = *(uint *)(args.ray + 0xcc) & auVar36._12_4_;
              auVar51._0_4_ = ~auVar36._0_4_ & *(uint *)args.hit;
              auVar51._4_4_ = ~auVar36._4_4_ & *(uint *)(args.hit + 4);
              auVar51._8_4_ = ~auVar36._8_4_ & *(uint *)(args.hit + 8);
              auVar51._12_4_ = ~auVar36._12_4_ & *(uint *)(args.hit + 0xc);
              *(undefined1 (*) [16])(args.ray + 0xc0) = auVar51 | auVar47;
              uVar29 = *(uint *)(args.hit + 0x14);
              uVar30 = *(uint *)(args.hit + 0x18);
              uVar31 = *(uint *)(args.hit + 0x1c);
              *(uint *)(args.ray + 0xd0) =
                   ~auVar36._0_4_ & *(uint *)(args.hit + 0x10) |
                   *(uint *)(args.ray + 0xd0) & auVar36._0_4_;
              *(uint *)(args.ray + 0xd4) =
                   ~auVar36._4_4_ & uVar29 | *(uint *)(args.ray + 0xd4) & auVar36._4_4_;
              *(uint *)(args.ray + 0xd8) =
                   ~auVar36._8_4_ & uVar30 | *(uint *)(args.ray + 0xd8) & auVar36._8_4_;
              *(uint *)(args.ray + 0xdc) =
                   ~auVar36._12_4_ & uVar31 | *(uint *)(args.ray + 0xdc) & auVar36._12_4_;
              *(undefined1 (*) [16])(args.ray + 0xe0) =
                   ~auVar36 & *(undefined1 (*) [16])(args.hit + 0x20) |
                   *(undefined1 (*) [16])(args.ray + 0xe0) & auVar36;
              *(undefined1 (*) [16])(args.ray + 0xf0) =
                   ~auVar36 & *(undefined1 (*) [16])(args.hit + 0x30) |
                   *(undefined1 (*) [16])(args.ray + 0xf0) & auVar36;
              uVar29 = *(uint *)(args.hit + 0x44);
              uVar30 = *(uint *)(args.hit + 0x48);
              uVar31 = *(uint *)(args.hit + 0x4c);
              *(uint *)(args.ray + 0x100) =
                   ~auVar36._0_4_ & *(uint *)(args.hit + 0x40) |
                   *(uint *)(args.ray + 0x100) & auVar36._0_4_;
              *(uint *)(args.ray + 0x104) =
                   ~auVar36._4_4_ & uVar29 | *(uint *)(args.ray + 0x104) & auVar36._4_4_;
              *(uint *)(args.ray + 0x108) =
                   ~auVar36._8_4_ & uVar30 | *(uint *)(args.ray + 0x108) & auVar36._8_4_;
              *(uint *)(args.ray + 0x10c) =
                   ~auVar36._12_4_ & uVar31 | *(uint *)(args.ray + 0x10c) & auVar36._12_4_;
              uVar29 = *(uint *)(args.hit + 0x54);
              uVar30 = *(uint *)(args.hit + 0x58);
              uVar31 = *(uint *)(args.hit + 0x5c);
              *(uint *)(args.ray + 0x110) =
                   *(uint *)(args.ray + 0x110) & auVar36._0_4_ |
                   ~auVar36._0_4_ & *(uint *)(args.hit + 0x50);
              *(uint *)(args.ray + 0x114) =
                   *(uint *)(args.ray + 0x114) & auVar36._4_4_ | ~auVar36._4_4_ & uVar29;
              *(uint *)(args.ray + 0x118) =
                   *(uint *)(args.ray + 0x118) & auVar36._8_4_ | ~auVar36._8_4_ & uVar30;
              *(uint *)(args.ray + 0x11c) =
                   *(uint *)(args.ray + 0x11c) & auVar36._12_4_ | ~auVar36._12_4_ & uVar31;
              uVar29 = *(uint *)(args.hit + 100);
              uVar30 = *(uint *)(args.hit + 0x68);
              uVar31 = *(uint *)(args.hit + 0x6c);
              *(uint *)(args.ray + 0x120) =
                   *(uint *)(args.ray + 0x120) & auVar36._0_4_ |
                   ~auVar36._0_4_ & *(uint *)(args.hit + 0x60);
              *(uint *)(args.ray + 0x124) =
                   *(uint *)(args.ray + 0x124) & auVar36._4_4_ | ~auVar36._4_4_ & uVar29;
              *(uint *)(args.ray + 0x128) =
                   *(uint *)(args.ray + 0x128) & auVar36._8_4_ | ~auVar36._8_4_ & uVar30;
              *(uint *)(args.ray + 300) =
                   *(uint *)(args.ray + 300) & auVar36._12_4_ | ~auVar36._12_4_ & uVar31;
              uVar29 = *(uint *)(args.hit + 0x74);
              uVar30 = *(uint *)(args.hit + 0x78);
              uVar31 = *(uint *)(args.hit + 0x7c);
              *(uint *)(args.ray + 0x130) =
                   ~auVar36._0_4_ & *(uint *)(args.hit + 0x70) |
                   *(uint *)(args.ray + 0x130) & auVar36._0_4_;
              *(uint *)(args.ray + 0x134) =
                   ~auVar36._4_4_ & uVar29 | *(uint *)(args.ray + 0x134) & auVar36._4_4_;
              *(uint *)(args.ray + 0x138) =
                   ~auVar36._8_4_ & uVar30 | *(uint *)(args.ray + 0x138) & auVar36._8_4_;
              *(uint *)(args.ray + 0x13c) =
                   ~auVar36._12_4_ & uVar31 | *(uint *)(args.ray + 0x13c) & auVar36._12_4_;
              *(undefined1 (*) [16])(args.ray + 0x140) =
                   ~auVar36 & *(undefined1 (*) [16])(args.hit + 0x80) |
                   *(undefined1 (*) [16])(args.ray + 0x140) & auVar36;
              pRVar24 = args.ray;
            }
          }
          auVar44._0_4_ = auVar40._0_4_ << 0x1f;
          auVar44._4_4_ = auVar40._4_4_ << 0x1f;
          auVar44._8_4_ = auVar40._8_4_ << 0x1f;
          auVar44._12_4_ = auVar40._12_4_ << 0x1f;
          iVar20 = movmskps((int)pRVar24,auVar44);
          uVar22 = CONCAT44((int)((ulong)pRVar24 >> 0x20),iVar20);
          if (iVar20 == 0) {
            *(undefined4 *)(ray + k * 4 + 0x80) = local_168._0_4_;
          }
          else {
            local_168._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
            local_168._4_4_ = 0;
            local_168._8_4_ = 0;
            local_168._12_4_ = 0;
          }
          *(undefined4 *)(local_1c8 + lVar25 * 4 + -0x10) = 0;
          valid.field_0.i[0] = -(uint)(fVar68 <= (float)local_168._0_4_) & valid.field_0.i[0];
          valid.field_0.i[1] = -(uint)(fVar70 <= (float)local_168._0_4_) & valid.field_0.i[1];
          valid.field_0.i[2] = -(uint)(fVar71 <= (float)local_168._0_4_) & valid.field_0.i[2];
          valid.field_0.i[3] = -(uint)(fVar72 <= (float)local_168._0_4_) & valid.field_0.i[3];
        }
        iVar20 = movmskps((int)uVar22,(undefined1  [16])valid.field_0);
        if (iVar20 == 0) {
          return;
        }
        uVar29 = valid.field_0._0_4_;
        uVar30 = valid.field_0._4_4_;
        uVar31 = valid.field_0._8_4_;
        uVar32 = valid.field_0._12_4_;
        auVar41._0_4_ = uVar29 & (uint)fVar68;
        auVar41._4_4_ = uVar30 & (uint)fVar70;
        auVar41._8_4_ = uVar31 & (uint)fVar71;
        auVar41._12_4_ = uVar32 & (uint)fVar72;
        auVar48._0_8_ = CONCAT44(~uVar30,~uVar29) & 0x7f8000007f800000;
        auVar48._8_4_ = ~uVar31 & 0x7f800000;
        auVar48._12_4_ = ~uVar32 & 0x7f800000;
        auVar48 = auVar48 | auVar41;
        auVar49._4_4_ = auVar48._0_4_;
        auVar49._0_4_ = auVar48._4_4_;
        auVar49._8_4_ = auVar48._12_4_;
        auVar49._12_4_ = auVar48._8_4_;
        auVar46 = minps(auVar49,auVar48);
        auVar42._0_8_ = auVar46._8_8_;
        auVar42._8_4_ = auVar46._0_4_;
        auVar42._12_4_ = auVar46._4_4_;
        auVar46 = minps(auVar42,auVar46);
        auVar43._0_8_ =
             CONCAT44(-(uint)(auVar46._4_4_ == auVar48._4_4_) & uVar30,
                      -(uint)(auVar46._0_4_ == auVar48._0_4_) & uVar29);
        auVar43._8_4_ = -(uint)(auVar46._8_4_ == auVar48._8_4_) & uVar31;
        auVar43._12_4_ = -(uint)(auVar46._12_4_ == auVar48._12_4_) & uVar32;
        iVar20 = movmskps(iVar20,auVar43);
        aVar37 = valid.field_0;
        if (iVar20 != 0) {
          aVar37.i[2] = auVar43._8_4_;
          aVar37._0_8_ = auVar43._0_8_;
          aVar37.i[3] = auVar43._12_4_;
        }
        uVar21 = movmskps(iVar20,(undefined1  [16])aVar37);
        uVar22 = CONCAT44((int)(uVar22 >> 0x20),uVar21);
        lVar25 = 0;
        if (uVar22 != 0) {
          for (; (uVar22 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
          }
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Vec3vf<M> n0;
        Disc.gather(v0, n0, geom);
        const vbool<M> valid = Disc.valid();
        DiscIntersectorK<M, K>::intersect(
            valid, ray, k, context, geom, pre, v0, n0,
            Intersect1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }